

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall
CMU462::Camera::configure(Camera *this,CameraInfo *info,size_t screenW,size_t screenH)

{
  float fVar1;
  Camera *pCVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  this->screenW = screenW;
  this->screenH = screenH;
  this->nClip = (double)info->nClip;
  this->fClip = (double)info->fClip;
  fVar1 = info->hFov;
  this->hFov = (double)fVar1;
  this->vFov = (double)info->vFov;
  dVar3 = tan((double)fVar1 * 0.017453292519943295 * 0.5);
  dVar4 = tan(this->vFov * 0.017453292519943295 * 0.5);
  auVar6._8_4_ = (int)(screenW >> 0x20);
  auVar6._0_8_ = screenW;
  auVar6._12_4_ = 0x45300000;
  auVar7._8_4_ = (int)(screenH >> 0x20);
  auVar7._0_8_ = screenH;
  auVar7._12_4_ = 0x45300000;
  dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)screenH) - 4503599627370496.0);
  dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)screenW) - 4503599627370496.0)) / dVar8;
  this->ar = dVar5;
  if (dVar5 <= dVar3 / dVar4) {
    if (dVar3 / dVar4 <= dVar5) goto LAB_00182ad0;
    pCVar2 = (Camera *)&this->vFov;
    dVar3 = tan(this->hFov * 0.017453292519943295 * 0.5);
    dVar3 = dVar3 / this->ar;
  }
  else {
    dVar3 = tan(this->vFov * 0.017453292519943295 * 0.5);
    dVar3 = dVar3 * this->ar;
    pCVar2 = this;
  }
  dVar3 = atan(dVar3);
  pCVar2->hFov = dVar3 * 57.29577951308232 + dVar3 * 57.29577951308232;
LAB_00182ad0:
  dVar3 = tan(this->vFov * 0.017453292519943295 * 0.5);
  this->screenDist = dVar8 / (dVar3 + dVar3);
  return;
}

Assistant:

void Camera::configure(const CameraInfo& info, size_t screenW, size_t screenH) {
    this->screenW = screenW;
    this->screenH = screenH;
    nClip = info.nClip;
    fClip = info.fClip;
    hFov = info.hFov;
    vFov = info.vFov;

    double ar1 = tan(radians(hFov) / 2) / tan(radians(vFov) / 2);
    ar = static_cast<double>(screenW) / screenH;
    if (ar1 < ar) {
      // hFov is too small
      hFov = 2 * degrees(atan(tan(radians(vFov) / 2) * ar));
    } else if (ar1 > ar) {
      // vFov is too small
      vFov = 2 * degrees(atan(tan(radians(hFov) / 2) / ar));
    }
    screenDist = ((double) screenH) / (2.0 * tan(radians(vFov) / 2));
  }